

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hal_jpege_hdr.c
# Opt level: O2

MPP_RET write_jpeg_header(JpegeBits *bits,JpegeSyntax *syntax,RK_U8 **qtables)

{
  uint uVar1;
  RK_U32 value;
  RK_U8 *pRVar2;
  RK_U8 (*paRVar3) [64];
  ulong uVar4;
  long lVar5;
  RK_U32 RVar6;
  long lVar7;
  
  uVar1 = syntax->comment_length;
  RVar6 = syntax->nb_components;
  if ((ulong)uVar1 != 0) {
    pRVar2 = syntax->comment_data;
    jpege_bits_put(bits,0xfffe,0x10);
    jpege_bits_put(bits,uVar1 + 2,0x10);
    for (uVar4 = 0; uVar1 != uVar4; uVar4 = uVar4 + 1) {
      jpege_bits_put(bits,(uint)pRVar2[uVar4],8);
    }
  }
  if (*qtables == (RK_U8 *)0x0) {
    paRVar3 = (RK_U8 (*) [64])syntax->qtable_y;
    if (paRVar3 == (RK_U8 (*) [64])0x0) {
      paRVar3 = qtable_y + syntax->quality;
    }
    *qtables = *paRVar3;
  }
  if (qtables[1] == (RK_U8 *)0x0) {
    paRVar3 = (RK_U8 (*) [64])syntax->qtable_c;
    if (paRVar3 == (RK_U8 (*) [64])0x0) {
      paRVar3 = qtable_c + syntax->quality;
    }
    qtables[1] = *paRVar3;
  }
  for (lVar5 = 0; lVar5 != (ulong)(RVar6 != 1) + 1; lVar5 = lVar5 + 1) {
    pRVar2 = qtables[lVar5];
    jpege_bits_put(bits,0xffdb,0x10);
    jpege_bits_put(bits,0x43,0x10);
    jpege_bits_put(bits,0,4);
    jpege_bits_put(bits,(RK_U32)lVar5,4);
    for (lVar7 = 0; lVar7 != 0x40; lVar7 = lVar7 + 1) {
      jpege_bits_put(bits,(uint)pRVar2[""[lVar7]],8);
    }
  }
  RVar6 = syntax->width;
  value = syntax->height;
  jpege_bits_put(bits,0xffc0,0x10);
  jpege_bits_put(bits,syntax->nb_components * 3 + 8,0x10);
  jpege_bits_put(bits,8,8);
  jpege_bits_put(bits,value,0x10);
  jpege_bits_put(bits,RVar6,0x10);
  jpege_bits_put(bits,syntax->nb_components,8);
  for (uVar4 = 0; uVar4 < syntax->nb_components; uVar4 = uVar4 + 1) {
    jpege_bits_put(bits,(uint)*(byte *)(syntax->comp_info + uVar4),8);
    jpege_bits_put(bits,(uint)*(byte *)((long)syntax->comp_info + uVar4 * 4 + 1),4);
    jpege_bits_put(bits,(uint)*(byte *)((long)syntax->comp_info + uVar4 * 4 + 2),4);
    jpege_bits_put(bits,(uint)*(byte *)((long)syntax->comp_info + uVar4 * 4 + 3),8);
  }
  write_jpeg_RestartInterval(bits,syntax);
  jpege_bits_put(bits,0xffc4,0x10);
  jpege_bits_put(bits,0x1f,0x10);
  jpege_bits_put(bits,0,4);
  jpege_bits_put(bits,(uint)*(byte *)((long)syntax->comp_info + 3),4);
  for (lVar5 = 0; lVar5 != 0x80; lVar5 = lVar5 + 8) {
    jpege_bits_put(bits,*(RK_U32 *)((long)&dc_li[0].val_y + lVar5),8);
  }
  for (lVar5 = 0; lVar5 != 0x60; lVar5 = lVar5 + 8) {
    jpege_bits_put(bits,*(RK_U32 *)((long)&dc_vij[0].val_y + lVar5),8);
  }
  jpege_bits_put(bits,0xffc4,0x10);
  jpege_bits_put(bits,0xb5,0x10);
  jpege_bits_put(bits,1,4);
  jpege_bits_put(bits,(uint)*(byte *)((long)syntax->comp_info + 3),4);
  for (lVar5 = 0; lVar5 != 0x80; lVar5 = lVar5 + 8) {
    jpege_bits_put(bits,*(RK_U32 *)((long)&ac_li[0].val_y + lVar5),8);
  }
  for (lVar5 = 0; lVar5 != 0x510; lVar5 = lVar5 + 8) {
    jpege_bits_put(bits,*(RK_U32 *)((long)&ac_vij[0].val_y + lVar5),8);
  }
  RVar6 = 1;
  if (syntax->nb_components != 1) {
    jpege_bits_put(bits,0xffc4,0x10);
    jpege_bits_put(bits,0x1f,0x10);
    jpege_bits_put(bits,0,4);
    jpege_bits_put(bits,(uint)*(byte *)((long)syntax->comp_info + 7),4);
    for (lVar5 = 0; lVar5 != 0x10; lVar5 = lVar5 + 1) {
      jpege_bits_put(bits,dc_li[lVar5].val_c,8);
    }
    for (lVar5 = 0; lVar5 != 0xc; lVar5 = lVar5 + 1) {
      jpege_bits_put(bits,dc_vij[lVar5].val_c,8);
    }
    jpege_bits_put(bits,0xffc4,0x10);
    jpege_bits_put(bits,0xb5,0x10);
    jpege_bits_put(bits,1,4);
    jpege_bits_put(bits,(uint)*(byte *)((long)syntax->comp_info + 7),4);
    for (lVar5 = 0; lVar5 != 0x10; lVar5 = lVar5 + 1) {
      jpege_bits_put(bits,ac_li[lVar5].val_c,8);
    }
    for (lVar5 = 0; lVar5 != 0xa2; lVar5 = lVar5 + 1) {
      jpege_bits_put(bits,ac_vij[lVar5].val_c,8);
    }
    RVar6 = syntax->nb_components;
  }
  jpege_bits_put(bits,0xffda,0x10);
  jpege_bits_put(bits,RVar6 * 2 + 6,0x10);
  jpege_bits_put(bits,RVar6,8);
  for (uVar4 = 0; RVar6 != uVar4; uVar4 = uVar4 + 1) {
    jpege_bits_put(bits,(uint)*(byte *)(syntax->comp_info + uVar4),8);
    jpege_bits_put(bits,(uint)*(byte *)((long)syntax->comp_info + uVar4 * 4 + 3),4);
    jpege_bits_put(bits,(uint)*(byte *)((long)syntax->comp_info + uVar4 * 4 + 3),4);
  }
  jpege_bits_put(bits,0,8);
  jpege_bits_put(bits,0x3f,8);
  jpege_bits_put(bits,0,4);
  jpege_bits_put(bits,0,4);
  jpege_bits_align_byte(bits);
  return MPP_OK;
}

Assistant:

MPP_RET write_jpeg_header(JpegeBits *bits, JpegeSyntax *syntax, const RK_U8 *qtables[2])
{
    RK_U32 i = 0;
    RK_U32 qtable_number = syntax->nb_components == 1 ? 1 : 2;

    /* Com header */
    if (syntax->comment_length)
        write_jpeg_comment_header(bits, syntax);

    /* Quant header */
    if (!qtables[0]) {
        if (syntax->qtable_y)
            qtables[0] = syntax->qtable_y;
        else
            qtables[0] = qtable_y[syntax->quality];
    }

    if (!qtables[1]) {
        if (syntax->qtable_c)
            qtables[1] = syntax->qtable_c;
        else
            qtables[1] = qtable_c[syntax->quality];
    }

    for (i = 0; i < qtable_number; i++)
        write_jpeg_dqt_header(bits, qtables[i], i);

    /* Frame header */
    write_jpeg_SOFO_header(bits, syntax);

    /* Do NOT have Restart interval */
    write_jpeg_RestartInterval(bits, syntax);

    /* Huffman header */
    write_jpeg_dht_header(bits, syntax);

    /* Scan header */
    write_jpeg_sos_header(bits, syntax);

    jpege_bits_align_byte(bits);
    return MPP_OK;
}